

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O0

TranslatorTypes helics::translatorTypeFromString(string_view translatorType)

{
  bool bVar1;
  const_iterator this;
  pointer ppVar2;
  string nfilt;
  const_iterator fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  _Self in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Self local_28;
  _Self local_20 [3];
  TranslatorTypes local_4;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
       ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
               *)in_stack_ffffffffffffff38,(key_type *)0x31919b);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
       ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
              *)in_stack_ffffffffffffff38);
  bVar1 = std::operator==(local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __first._M_current = (char *)&local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_,
               (allocator<char> *)in_stack_ffffffffffffff70._M_node);
    std::allocator<char>::~allocator(&local_49);
    __result._M_current = (char *)&local_48;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_ffffffffffffff38);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __result._M_current);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_ffffffffffffff38);
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (__first,in_stack_ffffffffffffff50,__result,(_func_int_int *)in_stack_ffffffffffffff40
              );
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff40);
    this = std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
           ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
                   *)in_stack_ffffffffffffff38,(key_type *)0x3192ba);
    local_20[0]._M_node = this._M_node;
    std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
    ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>_>
           *)in_stack_ffffffffffffff38);
    bVar1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffff70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_4 = UNRECOGNIZED;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>
                             *)0x319310);
      local_4 = ppVar2->second;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_node);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::TranslatorTypes>_>
                           *)0x3191ed);
    local_4 = ppVar2->second;
  }
  return local_4;
}

Assistant:

TranslatorTypes translatorTypeFromString(std::string_view translatorType) noexcept
{
    auto fnd = translatorTypes.find(translatorType);
    if (fnd != translatorTypes.end()) {
        return fnd->second;
    }
    std::string nfilt{translatorType};
    std::transform(nfilt.begin(), nfilt.end(), nfilt.begin(), ::tolower);
    fnd = translatorTypes.find(nfilt);
    if (fnd != translatorTypes.end()) {
        return fnd->second;
    }
    return TranslatorTypes::UNRECOGNIZED;
}